

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc_wrapper.cpp
# Opt level: O2

size_t duckdb::Utf8Proc::RenderWidth(string *str)

{
  int32_t uc;
  undefined8 in_RAX;
  utf8proc_property_t *puVar1;
  ulong uVar2;
  size_t sVar3;
  int sz;
  undefined8 uStack_28;
  
  sVar3 = 0;
  uStack_28 = in_RAX;
  for (uVar2 = 0; uVar2 < str->_M_string_length; uVar2 = uVar2 + (long)uStack_28._4_4_) {
    uc = UTF8ToCodepoint((str->_M_dataplus)._M_p + uVar2,(int *)((long)&uStack_28 + 4));
    puVar1 = utf8proc_get_property(uc);
    sVar3 = sVar3 + (*(ushort *)&puVar1->field_0x14 >> 4 & 3);
  }
  return sVar3;
}

Assistant:

size_t Utf8Proc::RenderWidth(const std::string &str) {
	size_t render_width = 0;
	size_t pos = 0;
	while (pos < str.size()) {
		int sz;
		auto codepoint = Utf8Proc::UTF8ToCodepoint(str.c_str() + pos, sz);
		auto properties = duckdb::utf8proc_get_property(codepoint);
		render_width += properties->charwidth;
		pos += sz;
	}
	return render_width;
}